

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O0

int frames_in_buffer_pool(DECODER_MODEL *decoder_model)

{
  FRAME_BUFFER *this_buffer;
  int i;
  int frames_in_pool;
  DECODER_MODEL *decoder_model_local;
  
  frames_in_pool = 0;
  for (i = 0; i < 10; i = i + 1) {
    if ((0 < decoder_model->frame_buffer_pool[i].decoder_ref_count) ||
       (0 < decoder_model->frame_buffer_pool[i].player_ref_count)) {
      frames_in_pool = frames_in_pool + 1;
    }
  }
  return frames_in_pool;
}

Assistant:

static int frames_in_buffer_pool(const DECODER_MODEL *const decoder_model) {
  int frames_in_pool = 0;
  for (int i = 0; i < BUFFER_POOL_MAX_SIZE; ++i) {
    const FRAME_BUFFER *const this_buffer =
        &decoder_model->frame_buffer_pool[i];
    if (this_buffer->decoder_ref_count > 0 ||
        this_buffer->player_ref_count > 0) {
      ++frames_in_pool;
    }
  }
  return frames_in_pool;
}